

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundostack.cpp
# Opt level: O0

void __thiscall QUndoStack::~QUndoStack(QUndoStack *this)

{
  QUndoStackPrivate *this_00;
  QObject *in_RDI;
  QUndoStackPrivate *d;
  QObject *stack;
  
  *(undefined ***)in_RDI = &PTR_metaObject_00e24208;
  stack = in_RDI;
  this_00 = d_func((QUndoStack *)0xa824b9);
  if (this_00->group != (QUndoGroup *)0x0) {
    QUndoGroup::removeStack((QUndoGroup *)this_00,(QUndoStack *)stack);
  }
  clear((QUndoStack *)stack);
  QObject::~QObject(in_RDI);
  return;
}

Assistant:

QUndoStack::~QUndoStack()
{
#if QT_CONFIG(undogroup)
    Q_D(QUndoStack);
    if (d->group != nullptr)
        d->group->removeStack(this);
#endif
    clear();
}